

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNoClear(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int p_col,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_work,int *p_idx,int num)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  cpp_dec_float<100U,_int,_void> *pcVar10;
  byte bVar11;
  long lVar12;
  int32_t *piVar13;
  long lVar14;
  fpclass_type *pfVar15;
  cpp_dec_float<100U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_1b8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_160;
  cpp_dec_float<100U,_int,_void> *local_158;
  pointer local_150;
  cpp_dec_float<100U,_int,_void> local_148;
  int *local_f0;
  int *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  uint uStack_b0;
  uint local_ac;
  uint uStack_a8;
  undefined8 uStack_a4;
  uint *local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  uStack_a8 = 0;
  uStack_a4 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  local_ac = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_148.fpclass = cpp_dec_float_finite;
  local_148.prec_elem = 0x10;
  local_148.data._M_elems[0] = 0;
  local_148.data._M_elems[1] = 0;
  local_148.data._M_elems[2] = 0;
  local_148.data._M_elems[3] = 0;
  local_148.data._M_elems[4] = 0;
  local_148.data._M_elems[5] = 0;
  local_148.data._M_elems[6] = 0;
  local_148.data._M_elems[7] = 0;
  local_148.data._M_elems[8] = 0;
  local_148.data._M_elems[9] = 0;
  local_148.data._M_elems[10] = 0;
  local_148.data._M_elems[0xb] = 0;
  local_148.data._M_elems[0xc] = 0;
  local_148.data._M_elems[0xd] = 0;
  local_148.data._M_elems._56_5_ = 0;
  local_148.data._M_elems[0xf]._1_3_ = 0;
  local_148.exp = 0;
  local_148.neg = false;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  local_e8 = p_idx;
  local_e0 = p_work;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_1b8,1,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_88,&local_1b8,&p_work[p_col].m_backend);
  piVar9 = local_e8;
  local_148.data._M_elems[0] = local_88.data._M_elems[0];
  local_148.data._M_elems[1] = local_88.data._M_elems[1];
  local_148.data._M_elems[2] = local_88.data._M_elems[2];
  local_148.data._M_elems[3] = local_88.data._M_elems[3];
  local_148.data._M_elems[4] = local_88.data._M_elems[4];
  local_148.data._M_elems[5] = local_88.data._M_elems[5];
  local_148.data._M_elems[6] = local_88.data._M_elems[6];
  local_148.data._M_elems[7] = local_88.data._M_elems[7];
  local_148.data._M_elems[8] = local_88.data._M_elems[8];
  local_148.data._M_elems[9] = local_88.data._M_elems[9];
  local_148.data._M_elems[10] = local_88.data._M_elems[10];
  local_148.data._M_elems[0xb] = local_88.data._M_elems[0xb];
  local_148.data._M_elems[0xc] = local_88.data._M_elems[0xc];
  local_148.data._M_elems[0xd] = local_88.data._M_elems[0xd];
  local_148.data._M_elems._56_5_ = local_88.data._M_elems._56_5_;
  local_148.data._M_elems[0xf]._1_3_ = local_88.data._M_elems[0xf]._1_3_;
  local_148.exp = local_88.exp;
  local_148.neg = local_88.neg;
  local_148.fpclass = local_88.fpclass;
  local_148.prec_elem = local_88.prec_elem;
  iVar6 = makeLvec(this,num,p_col);
  local_150 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (this->l).idx;
  iVar7 = piVar9[(long)num + -1];
  local_160 = this;
  if (iVar7 != p_col) {
    local_158 = (cpp_dec_float<100U,_int,_void> *)CONCAT44(local_158._4_4_,iVar6);
    piVar8 = local_f0 + iVar6;
    pfVar15 = &local_150[iVar6].m_backend.fpclass;
    lVar14 = 0;
    do {
      *piVar8 = iVar7;
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x10;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems._56_5_ = 0;
      local_1b8.data._M_elems[0xf]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      pcVar10 = &local_148;
      if (&local_1b8 != &local_e0[iVar7].m_backend) {
        local_1b8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
        local_1b8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
        local_1b8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
        local_1b8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
        local_1b8.data._M_elems[8] = local_148.data._M_elems[8];
        local_1b8.data._M_elems[9] = local_148.data._M_elems[9];
        local_1b8.data._M_elems[10] = local_148.data._M_elems[10];
        local_1b8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
        local_1b8.data._M_elems[4] = local_148.data._M_elems[4];
        local_1b8.data._M_elems[5] = local_148.data._M_elems[5];
        local_1b8.data._M_elems[6] = local_148.data._M_elems[6];
        local_1b8.data._M_elems[7] = local_148.data._M_elems[7];
        local_1b8.data._M_elems[0] = local_148.data._M_elems[0];
        local_1b8.data._M_elems[1] = local_148.data._M_elems[1];
        local_1b8.data._M_elems[2] = local_148.data._M_elems[2];
        local_1b8.data._M_elems[3] = local_148.data._M_elems[3];
        local_1b8.exp = local_148.exp;
        local_1b8.neg = local_148.neg;
        local_1b8.fpclass = local_148.fpclass;
        local_1b8.prec_elem = local_148.prec_elem;
        pcVar10 = &local_e0[iVar7].m_backend;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_1b8,pcVar10);
      *(ulong *)(((cpp_dec_float<100U,_int,_void> *)(pfVar15 + -0x12))->data)._M_elems =
           CONCAT44(local_1b8.data._M_elems[1],local_1b8.data._M_elems[0]);
      *(ulong *)(pfVar15 + -0x10) = CONCAT44(local_1b8.data._M_elems[3],local_1b8.data._M_elems[2]);
      *(ulong *)(pfVar15 + -0xe) = CONCAT44(local_1b8.data._M_elems[5],local_1b8.data._M_elems[4]);
      *(ulong *)(pfVar15 + -0xc) = CONCAT44(local_1b8.data._M_elems[7],local_1b8.data._M_elems[6]);
      *(ulong *)(pfVar15 + -10) = CONCAT44(local_1b8.data._M_elems[9],local_1b8.data._M_elems[8]);
      *(ulong *)(pfVar15 + -8) = CONCAT44(local_1b8.data._M_elems[0xb],local_1b8.data._M_elems[10]);
      *(ulong *)(pfVar15 + -6) = CONCAT44(local_1b8.data._M_elems[0xd],local_1b8.data._M_elems[0xc])
      ;
      *(ulong *)(pfVar15 + -4) =
           CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
      pfVar15[-2] = local_1b8.exp;
      *(bool *)(pfVar15 + -1) = local_1b8.neg;
      *(undefined8 *)pfVar15 = local_1b8._72_8_;
      iVar7 = piVar9[(long)(num + -1) + lVar14 + -1];
      piVar8 = piVar8 + 1;
      pfVar15 = pfVar15 + 0x14;
      lVar14 = lVar14 + -1;
    } while (iVar7 != p_col);
    iVar6 = (int)local_158 - (int)lVar14;
    num = num + (int)lVar14;
  }
  lVar14 = (long)iVar6;
  local_f0[lVar14] = p_col;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_1b8,1,(type *)0x0);
  local_88.data._M_elems[0xc] = local_148.data._M_elems[0xc];
  local_88.data._M_elems[0xd] = local_148.data._M_elems[0xd];
  local_88.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
  local_88.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
  local_88.data._M_elems[8] = local_148.data._M_elems[8];
  local_88.data._M_elems[9] = local_148.data._M_elems[9];
  local_88.data._M_elems[10] = local_148.data._M_elems[10];
  local_88.data._M_elems[0xb] = local_148.data._M_elems[0xb];
  local_88.data._M_elems[4] = local_148.data._M_elems[4];
  local_88.data._M_elems[5] = local_148.data._M_elems[5];
  local_88.data._M_elems[6] = local_148.data._M_elems[6];
  local_88.data._M_elems[7] = local_148.data._M_elems[7];
  local_88.data._M_elems[0] = local_148.data._M_elems[0];
  local_88.data._M_elems[1] = local_148.data._M_elems[1];
  local_88.data._M_elems[2] = local_148.data._M_elems[2];
  local_88.data._M_elems[3] = local_148.data._M_elems[3];
  local_88.exp = local_148.exp;
  local_88.neg = local_148.neg;
  local_88.fpclass = local_148.fpclass;
  local_88.prec_elem = local_148.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_88,&local_1b8);
  if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
    local_88.neg = (bool)(local_88.neg ^ 1);
  }
  puVar1 = (uint *)((long)local_150[lVar14].m_backend.data._M_elems + 0x30);
  *(undefined8 *)puVar1 = local_88.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_88.data._M_elems[0xf]._1_3_,local_88.data._M_elems._56_5_)
  ;
  puVar1 = (uint *)((long)local_150[lVar14].m_backend.data._M_elems + 0x20);
  *(undefined8 *)puVar1 = local_88.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_88.data._M_elems._40_8_;
  puVar1 = (uint *)((long)local_150[lVar14].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_88.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_88.data._M_elems._24_8_;
  *(undefined8 *)local_150[lVar14].m_backend.data._M_elems = local_88.data._M_elems._0_8_;
  *(undefined8 *)((long)local_150[lVar14].m_backend.data._M_elems + 8) =
       local_88.data._M_elems._8_8_;
  local_150[lVar14].m_backend.exp = local_88.exp;
  local_150[lVar14].m_backend.neg = local_88.neg;
  local_150[lVar14].m_backend.fpclass = local_88.fpclass;
  local_150[lVar14].m_backend.prec_elem = local_88.prec_elem;
  if (1 < num) {
    local_158 = &(local_160->maxabs).m_backend;
    local_90 = (local_160->maxabs).m_backend.data._M_elems + 1;
    piVar9 = local_f0 + lVar14;
    piVar13 = &local_150[lVar14 + 1].m_backend.prec_elem;
    lVar14 = (ulong)(num - 2) + 1;
    do {
      piVar9 = piVar9 + 1;
      iVar7 = local_e8[lVar14 + -1];
      *piVar9 = iVar7;
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x10;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems._56_5_ = 0;
      local_1b8.data._M_elems[0xf]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      pcVar10 = &local_148;
      if (&local_1b8 != &local_e0[iVar7].m_backend) {
        local_1b8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
        local_1b8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
        local_1b8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
        local_1b8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
        local_1b8.data._M_elems[8] = local_148.data._M_elems[8];
        local_1b8.data._M_elems[9] = local_148.data._M_elems[9];
        local_1b8.data._M_elems[10] = local_148.data._M_elems[10];
        local_1b8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
        local_1b8.data._M_elems[4] = local_148.data._M_elems[4];
        local_1b8.data._M_elems[5] = local_148.data._M_elems[5];
        local_1b8.data._M_elems[6] = local_148.data._M_elems[6];
        local_1b8.data._M_elems[7] = local_148.data._M_elems[7];
        local_1b8.data._M_elems[0] = local_148.data._M_elems[0];
        local_1b8.data._M_elems[1] = local_148.data._M_elems[1];
        local_1b8.data._M_elems[2] = local_148.data._M_elems[2];
        local_1b8.data._M_elems[3] = local_148.data._M_elems[3];
        local_1b8.exp = local_148.exp;
        local_1b8.neg = local_148.neg;
        local_1b8.fpclass = local_148.fpclass;
        local_1b8.prec_elem = local_148.prec_elem;
        pcVar10 = &local_e0[iVar7].m_backend;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_1b8,pcVar10);
      bVar11 = local_1b8.neg;
      uVar3 = local_1b8.data._M_elems[0];
      local_d8 = CONCAT44(local_1b8.data._M_elems[2],local_1b8.data._M_elems[1]);
      uStack_d0 = CONCAT44(local_1b8.data._M_elems[4],local_1b8.data._M_elems[3]);
      local_c8 = CONCAT44(local_1b8.data._M_elems[6],local_1b8.data._M_elems[5]);
      uStack_c0 = CONCAT44(local_1b8.data._M_elems[8],local_1b8.data._M_elems[7]);
      uStack_b8 = CONCAT44(local_1b8.data._M_elems[10],local_1b8.data._M_elems[9]);
      uStack_a4 = CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
      uStack_b0 = local_1b8.data._M_elems[0xb];
      local_ac = local_1b8.data._M_elems[0xc];
      uStack_a8 = local_1b8.data._M_elems[0xd];
      fVar4 = local_1b8.fpclass;
      iVar5 = local_1b8.prec_elem;
      (((cpp_dec_float<100U,_int,_void> *)(piVar13 + -0x13))->data)._M_elems[0] =
           local_1b8.data._M_elems[0];
      *(ulong *)(piVar13 + -7) = CONCAT44(local_1b8.data._M_elems[0xd],local_1b8.data._M_elems[0xc])
      ;
      *(undefined8 *)(piVar13 + -5) = uStack_a4;
      *(undefined8 *)(piVar13 + -10) = uStack_b8;
      *(ulong *)(piVar13 + -8) = CONCAT44(local_1b8.data._M_elems[0xc],local_1b8.data._M_elems[0xb])
      ;
      *(undefined8 *)(piVar13 + -0xe) = local_c8;
      *(undefined8 *)(piVar13 + -0xc) = uStack_c0;
      *(undefined8 *)(piVar13 + -0x12) = local_d8;
      *(undefined8 *)(piVar13 + -0x10) = uStack_d0;
      piVar13[-3] = local_1b8.exp;
      *(bool *)(piVar13 + -2) = local_1b8.neg;
      piVar13[-1] = local_1b8.fpclass;
      *piVar13 = local_1b8.prec_elem;
      if ((local_1b8.neg == true) &&
         (local_1b8.fpclass != cpp_dec_float_finite || local_1b8.data._M_elems[0] != 0)) {
        local_1b8.neg = false;
      }
      if ((local_1b8.fpclass != cpp_dec_float_NaN) &&
         ((local_160->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
        local_150 = (pointer)CONCAT44(local_150._4_4_,local_1b8.exp);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_1b8,local_158);
        if (0 < iVar7) {
          if ((bool)bVar11 != false) {
            bVar11 = bVar11 ^ (fVar4 != cpp_dec_float_finite || uVar3 != 0);
          }
          (local_160->maxabs).m_backend.data._M_elems[0] = uVar3;
          *(ulong *)(local_90 + 0xb) = CONCAT44(uStack_a8,local_ac);
          *(undefined8 *)(local_90 + 0xd) = uStack_a4;
          *(undefined8 *)(local_90 + 8) = uStack_b8;
          *(ulong *)(local_90 + 10) = CONCAT44(local_ac,uStack_b0);
          *(undefined8 *)(local_90 + 4) = local_c8;
          *(undefined8 *)(local_90 + 6) = uStack_c0;
          *(undefined8 *)local_90 = local_d8;
          *(undefined8 *)(local_90 + 2) = uStack_d0;
          (local_160->maxabs).m_backend.exp = (int)local_150;
          (local_160->maxabs).m_backend.neg = (bool)bVar11;
          (local_160->maxabs).m_backend.fpclass = fVar4;
          (local_160->maxabs).m_backend.prec_elem = iVar5;
        }
      }
      piVar13 = piVar13 + 0x14;
      lVar12 = lVar14 + -1;
      bVar2 = 0 < lVar14;
      lVar14 = lVar12;
    } while (lVar12 != 0 && bVar2);
  }
  local_160->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}